

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O2

void __thiscall
OpenMD::EAM::addExplicitInteraction
          (EAM *this,AtomType *atype1,AtomType *atype2,RealType re,RealType alpha,RealType A,
          RealType Ci,RealType Cj)

{
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  *this_00;
  int iVar1;
  int iVar2;
  long lVar3;
  int i;
  int iVar4;
  long lVar5;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar6;
  pair<double,_double> pVar7;
  int atid2;
  int atid1;
  RealType r;
  CubicSplinePtr cs;
  RealType phiCC;
  EAMInteractionData mixer;
  vector<double,_std::allocator<double>_> phiVals;
  vector<double,_std::allocator<double>_> rVals;
  int local_110;
  int local_10c;
  double local_108;
  RealType local_100;
  __shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> local_f8;
  AtomType *local_e8;
  RealType local_e0;
  AtomType *local_d8;
  RealType local_d0;
  RealType local_c8;
  RealType local_c0;
  double local_b8;
  RealType local_b0;
  EAMInteractionData local_a8;
  _Vector_base<double,_std::allocator<double>_> local_68;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  local_108 = re;
  local_e8 = atype2;
  local_e0 = Ci;
  local_d8 = atype1;
  local_d0 = Cj;
  local_c8 = alpha;
  local_c0 = A;
  std::make_shared<OpenMD::CubicSpline>();
  local_a8.Ci = 0.0;
  local_a8.Cj = 0.0;
  local_a8.phiCC.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_a8.phiCC.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8.phi.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (CubicSpline *)0x0;
  local_a8.phi.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8 = local_108 * 4.0;
  if (local_b8 <= 9.0) {
    local_b8 = 9.0;
  }
  if (12.0 <= local_b8) {
    local_b8 = 12.0;
  }
  local_b8 = local_b8 / 1999.0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (iVar4 = 0; iVar4 != 2000; iVar4 = iVar4 + 1) {
    local_100 = (double)iVar4 * local_b8;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)&local_48,&local_100);
    local_b0 = PhiCoreCore(this,local_100,local_108,local_c0,local_c8,0.0);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)&local_68,&local_b0);
  }
  CubicSpline::addPoints
            (local_f8._M_ptr,(vector<double,_std::allocator<double>_> *)&local_48,
             (vector<double,_std::allocator<double>_> *)&local_68);
  std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)&local_a8,&local_f8);
  pVar7 = CubicSpline::getLimits
                    (local_a8.phi.
                     super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_a8.rcut = pVar7.second;
  local_a8.Ci = local_e0;
  local_a8.Cj = local_d0;
  local_a8.explicitlySet = true;
  local_10c = AtomType::getIdent(local_d8);
  local_110 = AtomType::getIdent(local_e8);
  pVar6 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->EAMtypes,&local_10c);
  if (pVar6.second == false) {
    iVar4 = (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_10c];
  }
  else {
    iVar4 = this->nEAM_;
    (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[local_10c] = iVar4;
    this->nEAM_ = iVar4 + 1;
  }
  pVar6 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->EAMtypes,&local_110);
  if (pVar6.second == false) {
    iVar2 = (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_110];
    iVar1 = this->nEAM_;
  }
  else {
    iVar2 = this->nEAM_;
    (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[local_110] = iVar2;
    iVar1 = iVar2 + 1;
    this->nEAM_ = iVar1;
  }
  this_00 = &this->MixingMap;
  std::
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ::resize(this_00,(long)iVar1);
  lVar5 = (long)iVar4;
  std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
            ((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar5,(long)this->nEAM_);
  lVar3 = (long)iVar2;
  EAMInteractionData::operator=
            ((EAMInteractionData *)
             (lVar3 * 0x40 +
             *(long *)&(this_00->
                       super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[lVar5].
                       super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                       ._M_impl.super__Vector_impl_data),&local_a8);
  if (iVar2 != iVar4) {
    std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
              ((this->MixingMap).
               super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar3,(long)this->nEAM_);
    EAMInteractionData::operator=
              ((EAMInteractionData *)
               (lVar5 * 0x40 +
               *(long *)&(this_00->
                         super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[lVar3].
                         super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                         ._M_impl.super__Vector_impl_data),&local_a8);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_68);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  EAMInteractionData::~EAMInteractionData(&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
  return;
}

Assistant:

void EAM::addExplicitInteraction(AtomType* atype1, AtomType* atype2,
                                   RealType re, RealType alpha, RealType A,
                                   RealType Ci, RealType Cj) {
    CubicSplinePtr cs {std::make_shared<CubicSpline>()};

    EAMInteractionData mixer;
    std::vector<RealType> rVals;
    std::vector<RealType> phiVals;

    int Nr = 2000;
    RealType r;
    RealType phiCC;

    RealType rcut = std::min(12.0, std::max(9.0, 4.0 * re));
    RealType dr   = rcut / (RealType)(Nr - 1);

    for (int i = 0; i < Nr; i++) {
      r = RealType(i) * dr;
      rVals.push_back(r);
      // for Dream2 and EAMOxide explicit potential we dont care about kappa
      // but it is needed while calling PhiCoreCore. So, lets define it as 0
      // its value however is not used in calculation
      RealType kappa = 0;
      phiCC          = PhiCoreCore(r, re, A, alpha, kappa);
      phiVals.push_back(phiCC);
    }

    cs->addPoints(rVals, phiVals);
    // this is the repulsive piece in explicit EAM Oxide potential
    // this is phiCC for the explicit EAM oxide potential for convinence, it
    // is represented as phi
    mixer.phi  = cs;
    mixer.rcut = mixer.phi->getLimits().second;

    mixer.Ci = Ci;
    mixer.Cj = Cj;

    mixer.explicitlySet = true;

    int atid1 = atype1->getIdent();
    int atid2 = atype2->getIdent();

    int eamtid1, eamtid2;

    pair<set<int>::iterator, bool> ret;
    ret = EAMtypes.insert(atid1);
    if (ret.second == false) {
      // already had this type in the EAMMap, just get the eamtid:
      eamtid1 = EAMtids[atid1];
    } else {
      // didn't already have it, so make a new one and assign it:
      eamtid1        = nEAM_;
      EAMtids[atid1] = nEAM_;
      nEAM_++;
    }

    ret = EAMtypes.insert(atid2);
    if (ret.second == false) {
      // already had this type in the EAMMap, just get the eamtid:
      eamtid2 = EAMtids[atid2];
    } else {
      // didn't already have it, so make a new one and assign it:
      eamtid2        = nEAM_;
      EAMtids[atid2] = nEAM_;
      nEAM_++;
    }

    MixingMap.resize(nEAM_);
    MixingMap[eamtid1].resize(nEAM_);
    MixingMap[eamtid1][eamtid2] = mixer;
    if (eamtid2 != eamtid1) {
      MixingMap[eamtid2].resize(nEAM_);
      MixingMap[eamtid2][eamtid1] = mixer;
    }
    return;
  }